

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlnumber.c
# Opt level: O0

ebml_integer * CopyInt(ebml_integer *Element)

{
  ebml_integer *peVar1;
  ebml_integer *Result;
  ebml_integer *Element_local;
  
  peVar1 = (ebml_integer *)EBML_ElementCreate(Element,(Element->Base).Context,0,-1);
  if (peVar1 != (ebml_integer *)0x0) {
    peVar1->Value = Element->Value;
    (peVar1->Base).bValueIsSet = (Element->Base).bValueIsSet;
    (peVar1->Base).DataSize = (Element->Base).DataSize;
    (peVar1->Base).ElementPosition = (Element->Base).ElementPosition;
    (peVar1->Base).SizeLength = (Element->Base).SizeLength;
    (peVar1->Base).SizePosition = (Element->Base).SizePosition;
    (peVar1->Base).EndPosition = (Element->Base).EndPosition;
    (peVar1->Base).bNeedDataSizeUpdate = (Element->Base).bNeedDataSizeUpdate;
  }
  return peVar1;
}

Assistant:

static ebml_integer *CopyInt(const ebml_integer *Element)
{
    ebml_integer *Result = (ebml_integer*)EBML_ElementCreate(Element,Element->Base.Context,0,EBML_ANY_PROFILE);
    if (Result)
    {
        Result->Value = Element->Value;
        Result->Base.bValueIsSet = Element->Base.bValueIsSet;
        Result->Base.DataSize = Element->Base.DataSize;
        Result->Base.ElementPosition = Element->Base.ElementPosition;
        Result->Base.SizeLength = Element->Base.SizeLength;
        Result->Base.SizePosition = Element->Base.SizePosition;
        Result->Base.EndPosition = Element->Base.EndPosition;
        Result->Base.bNeedDataSizeUpdate = Element->Base.bNeedDataSizeUpdate;
    }
    return Result;
}